

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropout_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::Dropout_x86_avx512::forward_inplace(Dropout_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [12];
  long lVar9;
  long lVar10;
  undefined1 (*pauVar11) [32];
  undefined1 (*pauVar12) [12];
  undefined8 in_RDX;
  long *in_RSI;
  long *in_RDI;
  __m128 _p_5;
  int i_5;
  float *ptr_5;
  int q_1;
  __m128 _p_4;
  int j_1;
  float *ptr_4;
  int i_4;
  __m128 _p_3;
  float *ptr_3;
  int i_3;
  __m128 _scale_1;
  int size_1;
  int channels_1;
  int h_1;
  int w_1;
  __m256 _p_2;
  int i_2;
  float *ptr_2;
  int q;
  __m256 _p_1;
  int j;
  float *ptr_1;
  int i_1;
  __m256 _p;
  float *ptr;
  int i;
  __m256 _scale;
  int size;
  int channels;
  int h;
  int w;
  Mat tmp;
  int elempack;
  int dims;
  Mat *m_1;
  Mat *m;
  Option *in_stack_fffffffffffff810;
  undefined8 in_stack_fffffffffffff818;
  int iVar13;
  Mat *in_stack_fffffffffffff820;
  Mat *in_stack_fffffffffffff828;
  float fStack_794;
  int local_78c;
  Option *in_stack_fffffffffffff888;
  Mat *in_stack_fffffffffffff890;
  Dropout *in_stack_fffffffffffff898;
  undefined1 (*local_740) [12];
  int local_734;
  float fStack_724;
  int local_714;
  undefined1 (*local_710) [12];
  int local_704;
  float fStack_6f4;
  int local_6e4;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  int local_69c;
  undefined1 (*local_650) [32];
  int local_644;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  int local_614;
  undefined1 (*local_610) [32];
  int local_604;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  int local_5c4;
  void *local_568;
  int *local_560;
  undefined8 local_558;
  undefined4 local_550;
  long *local_548;
  undefined4 local_540;
  undefined4 local_53c;
  undefined4 local_538;
  undefined4 local_534;
  undefined4 local_530;
  undefined8 local_528;
  int local_520;
  int local_51c;
  undefined8 local_518;
  int local_4fc;
  void **local_4f8;
  void **local_4f0;
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined4 uStack_444;
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined4 uStack_404;
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined4 uStack_3c4;
  float local_270;
  float fStack_26c;
  float fStack_268;
  float local_250;
  float fStack_24c;
  float fStack_248;
  float local_230;
  float fStack_22c;
  float fStack_228;
  int local_150;
  undefined4 local_14c;
  void **local_148;
  void *local_140;
  
  iVar13 = (int)((ulong)in_stack_fffffffffffff818 >> 0x20);
  fVar1 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
  if ((fVar1 != 1.0) || (NAN(fVar1))) {
    local_51c = (int)in_RSI[5];
    local_520 = (int)in_RSI[3];
    if (local_520 == 0x10) {
      local_4f8 = &local_568;
      local_568 = (void *)0x0;
      local_560 = (int *)0x0;
      local_558 = 0;
      local_550 = 0;
      local_548 = (long *)0x0;
      local_540 = 0;
      local_53c = 0;
      local_538 = 0;
      local_534 = 0;
      local_530 = 0;
      local_528 = 0;
      local_518 = in_RDX;
      convert_packing(in_stack_fffffffffffff828,in_stack_fffffffffffff820,iVar13,
                      in_stack_fffffffffffff810);
      (**(code **)*in_RDI)(in_RDI,&local_568,local_518);
      convert_packing(in_stack_fffffffffffff828,in_stack_fffffffffffff820,iVar13,
                      in_stack_fffffffffffff810);
      local_4fc = 0;
      local_4f0 = &local_568;
      if (local_560 != (int *)0x0) {
        local_14c = 0xffffffff;
        LOCK();
        local_150 = *local_560;
        *local_560 = *local_560 + -1;
        UNLOCK();
        if (local_150 == 1) {
          local_148 = local_4f0;
          if (local_548 == (long *)0x0) {
            local_140 = local_568;
            if (local_568 != (void *)0x0) {
              free(local_568);
            }
          }
          else {
            (**(code **)(*local_548 + 0x18))(local_548,local_568);
          }
        }
      }
    }
    else if (local_520 == 8) {
      iVar13 = *(int *)((long)in_RSI + 0x2c);
      lVar9 = in_RSI[6];
      lVar10 = in_RSI[7];
      uVar2 = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
      auVar3 = vinsertps_avx(ZEXT416(uVar2),ZEXT416(uVar2),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar2),0x20);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar2),0x30);
      auVar4 = vinsertps_avx(ZEXT416(uVar2),ZEXT416(uVar2),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar2),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar2),0x30);
      local_400 = auVar4._0_4_;
      fStack_3fc = auVar4._4_4_;
      fStack_3f8 = auVar4._8_4_;
      fStack_3f4 = auVar4._12_4_;
      fStack_3f0 = auVar3._0_4_;
      fStack_3ec = auVar3._4_4_;
      fStack_3e8 = auVar3._8_4_;
      if (local_51c == 1) {
        for (local_5c4 = 0; local_5c4 < iVar13; local_5c4 = local_5c4 + 1) {
          pauVar11 = (undefined1 (*) [32])(*in_RSI + (long)(local_5c4 << 3) * 4);
          local_3e0 = (float)*(undefined8 *)*pauVar11;
          fStack_3dc = (float)((ulong)*(undefined8 *)*pauVar11 >> 0x20);
          fStack_3d8 = (float)*(undefined8 *)(*pauVar11 + 8);
          fStack_3d4 = (float)((ulong)*(undefined8 *)(*pauVar11 + 8) >> 0x20);
          fStack_3d0 = (float)*(undefined8 *)(*pauVar11 + 0x10);
          fStack_3cc = (float)((ulong)*(undefined8 *)(*pauVar11 + 0x10) >> 0x20);
          fStack_3c8 = (float)*(undefined8 *)(*pauVar11 + 0x18);
          uStack_3c4 = (undefined4)((ulong)*(undefined8 *)(*pauVar11 + 0x18) >> 0x20);
          local_600 = CONCAT44(fStack_3dc * fStack_3fc,local_3e0 * local_400);
          uStack_5f8 = CONCAT44(fStack_3d4 * fStack_3f4,fStack_3d8 * fStack_3f8);
          uStack_5f0 = CONCAT44(fStack_3cc * fStack_3ec,fStack_3d0 * fStack_3f0);
          uStack_5e8 = CONCAT44(uStack_3c4,fStack_3c8 * fStack_3e8);
          auVar7._8_8_ = uStack_5f8;
          auVar7._0_8_ = local_600;
          auVar7._16_8_ = uStack_5f0;
          auVar7._24_8_ = uStack_5e8;
          *pauVar11 = auVar7;
        }
      }
      if (local_51c == 2) {
        for (local_604 = 0; local_604 < (int)lVar9; local_604 = local_604 + 1) {
          local_610 = (undefined1 (*) [32])
                      (*in_RSI + (long)*(int *)((long)in_RSI + 0x2c) * (long)local_604 * in_RSI[2]);
          for (local_614 = 0; local_614 < iVar13; local_614 = local_614 + 1) {
            local_420 = (float)*(undefined8 *)*local_610;
            fStack_41c = (float)((ulong)*(undefined8 *)*local_610 >> 0x20);
            fStack_418 = (float)*(undefined8 *)(*local_610 + 8);
            fStack_414 = (float)((ulong)*(undefined8 *)(*local_610 + 8) >> 0x20);
            fStack_410 = (float)*(undefined8 *)(*local_610 + 0x10);
            fStack_40c = (float)((ulong)*(undefined8 *)(*local_610 + 0x10) >> 0x20);
            fStack_408 = (float)*(undefined8 *)(*local_610 + 0x18);
            uStack_404 = (undefined4)((ulong)*(undefined8 *)(*local_610 + 0x18) >> 0x20);
            local_640 = CONCAT44(fStack_41c * fStack_3fc,local_420 * local_400);
            uStack_638 = CONCAT44(fStack_414 * fStack_3f4,fStack_418 * fStack_3f8);
            uStack_630 = CONCAT44(fStack_40c * fStack_3ec,fStack_410 * fStack_3f0);
            uStack_628 = CONCAT44(uStack_404,fStack_408 * fStack_3e8);
            auVar6._8_8_ = uStack_638;
            auVar6._0_8_ = local_640;
            auVar6._16_8_ = uStack_630;
            auVar6._24_8_ = uStack_628;
            *local_610 = auVar6;
            local_610 = local_610 + 1;
          }
        }
      }
      if (local_51c == 3) {
        for (local_644 = 0; local_644 < (int)lVar10; local_644 = local_644 + 1) {
          local_650 = (undefined1 (*) [32])(*in_RSI + in_RSI[8] * (long)local_644 * in_RSI[2]);
          for (local_69c = 0; local_69c < iVar13 * (int)lVar9; local_69c = local_69c + 1) {
            local_460 = (float)*(undefined8 *)*local_650;
            fStack_45c = (float)((ulong)*(undefined8 *)*local_650 >> 0x20);
            fStack_458 = (float)*(undefined8 *)(*local_650 + 8);
            fStack_454 = (float)((ulong)*(undefined8 *)(*local_650 + 8) >> 0x20);
            fStack_450 = (float)*(undefined8 *)(*local_650 + 0x10);
            fStack_44c = (float)((ulong)*(undefined8 *)(*local_650 + 0x10) >> 0x20);
            fStack_448 = (float)*(undefined8 *)(*local_650 + 0x18);
            uStack_444 = (undefined4)((ulong)*(undefined8 *)(*local_650 + 0x18) >> 0x20);
            local_6c0 = CONCAT44(fStack_45c * fStack_3fc,local_460 * local_400);
            uStack_6b8 = CONCAT44(fStack_454 * fStack_3f4,fStack_458 * fStack_3f8);
            uStack_6b0 = CONCAT44(fStack_44c * fStack_3ec,fStack_450 * fStack_3f0);
            uStack_6a8 = CONCAT44(uStack_444,fStack_448 * fStack_3e8);
            auVar5._8_8_ = uStack_6b8;
            auVar5._0_8_ = local_6c0;
            auVar5._16_8_ = uStack_6b0;
            auVar5._24_8_ = uStack_6a8;
            *local_650 = auVar5;
            local_650 = local_650 + 1;
          }
        }
      }
      local_4fc = 0;
    }
    else if (local_520 == 4) {
      iVar13 = *(int *)((long)in_RSI + 0x2c);
      lVar9 = in_RSI[6];
      lVar10 = in_RSI[7];
      fVar1 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
      if (local_51c == 1) {
        for (local_6e4 = 0; local_6e4 < iVar13; local_6e4 = local_6e4 + 1) {
          pauVar12 = (undefined1 (*) [12])(*in_RSI + (long)(local_6e4 << 2) * 4);
          auVar8 = *pauVar12;
          fStack_6f4 = (float)((ulong)*(undefined8 *)(*pauVar12 + 8) >> 0x20);
          local_230 = auVar8._0_4_;
          fStack_22c = auVar8._4_4_;
          fStack_228 = auVar8._8_4_;
          *(ulong *)*pauVar12 = CONCAT44(fStack_22c * fVar1,local_230 * fVar1);
          *(ulong *)(*pauVar12 + 8) = CONCAT44(fStack_6f4 * fVar1,fStack_228 * fVar1);
        }
      }
      if (local_51c == 2) {
        for (local_704 = 0; local_704 < (int)lVar9; local_704 = local_704 + 1) {
          local_710 = (undefined1 (*) [12])
                      (*in_RSI + (long)*(int *)((long)in_RSI + 0x2c) * (long)local_704 * in_RSI[2]);
          for (local_714 = 0; local_714 < iVar13; local_714 = local_714 + 1) {
            auVar8 = *local_710;
            fStack_724 = (float)((ulong)*(undefined8 *)(*local_710 + 8) >> 0x20);
            local_250 = auVar8._0_4_;
            fStack_24c = auVar8._4_4_;
            fStack_248 = auVar8._8_4_;
            *(ulong *)*local_710 = CONCAT44(fStack_24c * fVar1,local_250 * fVar1);
            *(ulong *)(*local_710 + 8) = CONCAT44(fStack_724 * fVar1,fStack_248 * fVar1);
            local_710 = (undefined1 (*) [12])(local_710[1] + 4);
          }
        }
      }
      if (local_51c == 3) {
        for (local_734 = 0; local_734 < (int)lVar10; local_734 = local_734 + 1) {
          local_740 = (undefined1 (*) [12])(*in_RSI + in_RSI[8] * (long)local_734 * in_RSI[2]);
          for (local_78c = 0; local_78c < iVar13 * (int)lVar9; local_78c = local_78c + 1) {
            auVar8 = *local_740;
            fStack_794 = (float)((ulong)*(undefined8 *)(*local_740 + 8) >> 0x20);
            local_270 = auVar8._0_4_;
            fStack_26c = auVar8._4_4_;
            fStack_268 = auVar8._8_4_;
            *(ulong *)*local_740 = CONCAT44(fStack_26c * fVar1,local_270 * fVar1);
            *(ulong *)(*local_740 + 8) = CONCAT44(fStack_794 * fVar1,fStack_268 * fVar1);
            local_740 = (undefined1 (*) [12])(local_740[1] + 4);
          }
        }
      }
      local_4fc = 0;
    }
    else {
      local_4fc = Dropout::forward_inplace
                            (in_stack_fffffffffffff898,in_stack_fffffffffffff890,
                             in_stack_fffffffffffff888);
    }
  }
  else {
    local_4fc = 0;
  }
  return local_4fc;
}

Assistant:

int Dropout_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (scale == 1.f)
    {
        return 0;
    }

#if __SSE2__
    int dims = bottom_top_blob.dims;
    int elempack = bottom_top_blob.elempack;

#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        Mat tmp;
        convert_packing(bottom_top_blob, tmp, 8, opt);

        forward_inplace(tmp, opt);

        convert_packing(tmp, bottom_top_blob, 16, opt);

        return 0;
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        __m256 _scale = _mm256_set1_ps(scale);

        if (dims == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 8;
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = _mm256_mul_ps(_p, _scale);
                _mm256_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _scale);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
            }
        }

        if (dims == 3)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _scale);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        __m128 _scale = _mm_set1_ps(scale);

        if (dims == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 4;
                __m128 _p = _mm_loadu_ps(ptr);
                _p = _mm_mul_ps(_p, _scale);
                _mm_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_mul_ps(_p, _scale);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
            }
        }

        if (dims == 3)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_mul_ps(_p, _scale);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    return Dropout::forward_inplace(bottom_top_blob, opt);
}